

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorPool::Tables::ClearLastCheckpoint(Tables *this)

{
  pointer pCVar1;
  pointer ppcVar2;
  pointer ppVar3;
  LogMessage *other;
  pointer pCVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x244);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pCVar1 = (this->checkpoints_).
           super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (this->checkpoints_).
           super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = pCVar4;
  if (pCVar1 == pCVar4) {
    ppcVar2 = (this->symbols_after_checkpoint_).
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->symbols_after_checkpoint_).
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar2) {
      (this->symbols_after_checkpoint_).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar2;
    }
    ppcVar2 = (this->files_after_checkpoint_).
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->files_after_checkpoint_).
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar2) {
      (this->files_after_checkpoint_).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar2;
    }
    ppVar3 = (this->extensions_after_checkpoint_).
             super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->extensions_after_checkpoint_).
        super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
      (this->extensions_after_checkpoint_).
      super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
    }
  }
  return;
}

Assistant:

void DescriptorPool::Tables::ClearLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  checkpoints_.pop_back();
  if (checkpoints_.empty()) {
    // All checkpoints have been cleared: we can now commit all of the pending
    // data.
    symbols_after_checkpoint_.clear();
    files_after_checkpoint_.clear();
    extensions_after_checkpoint_.clear();
  }
}